

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O1

int mbedtls_asn1_write_algorithm_identifier_ext
              (uchar **p,uchar *start,char *oid,size_t oid_len,size_t par_len,int has_par)

{
  uchar *puVar1;
  uint uVar2;
  int iVar3;
  
  if (has_par == 0) {
    par_len = 0;
  }
  else if (par_len == 0) {
    puVar1 = *p;
    if ((long)puVar1 - (long)start < 1) {
      uVar2 = 0xffffff94;
    }
    else {
      *p = puVar1 + -1;
      puVar1[-1] = '\0';
      uVar2 = 1;
    }
    if (puVar1 != start && -1 < (long)puVar1 - (long)start) {
      puVar1 = *p;
      if (puVar1 == start || (long)puVar1 - (long)start < 0) {
        iVar3 = -0x6c;
        uVar2 = 0;
      }
      else {
        *p = puVar1 + -1;
        puVar1[-1] = '\x05';
        iVar3 = 1;
      }
      uVar2 = uVar2 + iVar3;
    }
    if ((int)uVar2 < 0) {
      return uVar2;
    }
    par_len = (size_t)uVar2;
  }
  uVar2 = mbedtls_asn1_write_oid(p,start,oid,oid_len);
  if ((int)uVar2 < 0) {
    return uVar2;
  }
  iVar3 = mbedtls_asn1_write_len_and_tag(p,start,par_len + uVar2,'0');
  return iVar3;
}

Assistant:

int mbedtls_asn1_write_algorithm_identifier_ext(unsigned char **p, const unsigned char *start,
                                                const char *oid, size_t oid_len,
                                                size_t par_len, int has_par)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    if (has_par) {
        if (par_len == 0) {
            MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_null(p, start));
        } else {
            len += par_len;
        }
    }

    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_oid(p, start, oid, oid_len));

    return mbedtls_asn1_write_len_and_tag(p, start, len,
                                          MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE);
}